

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

int refreshVideoModes(_GLFWmonitor *monitor)

{
  GLFWvidmode *__base;
  int iVar1;
  int modeCount;
  int local_1c;
  
  iVar1 = 1;
  if (monitor->modes == (GLFWvidmode *)0x0) {
    __base = _glfwPlatformGetVideoModes(monitor,&local_1c);
    if (__base == (GLFWvidmode *)0x0) {
      iVar1 = 0;
    }
    else {
      qsort(__base,(long)local_1c,0x18,compareVideoModes);
      free(monitor->modes);
      monitor->modes = __base;
      monitor->modeCount = local_1c;
    }
  }
  return iVar1;
}

Assistant:

static int refreshVideoModes(_GLFWmonitor* monitor)
{
    int modeCount;
    GLFWvidmode* modes;

    if (monitor->modes)
        return GL_TRUE;

    modes = _glfwPlatformGetVideoModes(monitor, &modeCount);
    if (!modes)
        return GL_FALSE;

    qsort(modes, modeCount, sizeof(GLFWvidmode), compareVideoModes);

    free(monitor->modes);
    monitor->modes = modes;
    monitor->modeCount = modeCount;

    return GL_TRUE;
}